

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_type_free(ly_ctx *ctx,lys_type *type,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  uint local_24;
  uint i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_type *type_local;
  ly_ctx *ctx_local;
  
  if (ctx != (ly_ctx *)0x0) {
    if (type != (lys_type *)0x0) {
      lys_extension_instances_free(ctx,type->ext,(uint)type->ext_size,private_destructor);
      switch(type->base) {
      case LY_TYPE_BINARY:
        lys_restr_free(ctx,(type->info).dec64.range,private_destructor);
        free((type->info).bits.bit);
        break;
      case LY_TYPE_BITS:
        for (local_24 = 0; local_24 < (type->info).bits.count; local_24 = local_24 + 1) {
          lydict_remove(ctx,(type->info).bits.bit[local_24].name);
          lydict_remove(ctx,(type->info).bits.bit[local_24].dsc);
          lydict_remove(ctx,(type->info).bits.bit[local_24].ref);
          lys_iffeature_free(ctx,(type->info).bits.bit[local_24].iffeature,
                             (type->info).bits.bit[local_24].iffeature_size,0,private_destructor);
          lys_extension_instances_free
                    (ctx,(type->info).bits.bit[local_24].ext,
                     (uint)(type->info).bits.bit[local_24].ext_size,private_destructor);
        }
        free((type->info).bits.bit);
        break;
      default:
        break;
      case LY_TYPE_DEC64:
        lys_restr_free(ctx,(type->info).dec64.range,private_destructor);
        free((type->info).bits.bit);
        break;
      case LY_TYPE_ENUM:
        for (local_24 = 0; local_24 < (type->info).bits.count; local_24 = local_24 + 1) {
          lydict_remove(ctx,(type->info).bits.bit[local_24].name);
          lydict_remove(ctx,(type->info).bits.bit[local_24].dsc);
          lydict_remove(ctx,(type->info).bits.bit[local_24].ref);
          lys_iffeature_free(ctx,(type->info).bits.bit[local_24].iffeature,
                             (type->info).bits.bit[local_24].iffeature_size,0,private_destructor);
          lys_extension_instances_free
                    (ctx,(type->info).bits.bit[local_24].ext,
                     (uint)(type->info).bits.bit[local_24].ext_size,private_destructor);
        }
        free((type->info).bits.bit);
        break;
      case LY_TYPE_IDENT:
        free((type->info).bits.bit);
        break;
      case LY_TYPE_LEAFREF:
        lydict_remove(ctx,(type->info).lref.path);
        break;
      case LY_TYPE_STRING:
        lys_restr_free(ctx,(type->info).dec64.range,private_destructor);
        free((type->info).bits.bit);
        for (local_24 = 0; local_24 < (type->info).str.pat_count; local_24 = local_24 + 1) {
          lys_restr_free(ctx,(lys_restr *)
                             (((type->info).lref.target)->padding + (ulong)local_24 * 0x38 + -0x1c),
                         private_destructor);
          if ((type->info).str.patterns_pcre != (void **)0x0) {
            (*_pcre_free)((type->info).str.patterns_pcre[local_24 << 1]);
            pcre_free_study((type->info).str.patterns_pcre[local_24 * 2 + 1]);
          }
        }
        free((type->info).lref.target);
        free((type->info).str.patterns_pcre);
        break;
      case LY_TYPE_UNION:
        for (local_24 = 0; local_24 < (type->info).bits.count; local_24 = local_24 + 1) {
          lys_type_free(ctx,(lys_type *)((long)(type->info).bits.bit + (ulong)local_24 * 0x40),
                        private_destructor);
        }
        free((type->info).bits.bit);
        break;
      case LY_TYPE_INT8:
      case LY_TYPE_UINT8:
      case LY_TYPE_INT16:
      case LY_TYPE_UINT16:
      case LY_TYPE_INT32:
      case LY_TYPE_UINT32:
      case LY_TYPE_INT64:
      case LY_TYPE_UINT64:
        lys_restr_free(ctx,(type->info).dec64.range,private_destructor);
        free((type->info).bits.bit);
      }
    }
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                ,0x8d6,
                "void lys_type_free(struct ly_ctx *, struct lys_type *, void (*)(const struct lys_node *, void *))"
               );
}

Assistant:

void
lys_type_free(struct ly_ctx *ctx, struct lys_type *type,
              void (*private_destructor)(const struct lys_node *node, void *priv))
{
    unsigned int i;

    assert(ctx);
    if (!type) {
        return;
    }

    lys_extension_instances_free(ctx, type->ext, type->ext_size, private_destructor);

    switch (type->base) {
    case LY_TYPE_BINARY:
        lys_restr_free(ctx, type->info.binary.length, private_destructor);
        free(type->info.binary.length);
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; i++) {
            lydict_remove(ctx, type->info.bits.bit[i].name);
            lydict_remove(ctx, type->info.bits.bit[i].dsc);
            lydict_remove(ctx, type->info.bits.bit[i].ref);
            lys_iffeature_free(ctx, type->info.bits.bit[i].iffeature, type->info.bits.bit[i].iffeature_size, 0,
                               private_destructor);
            lys_extension_instances_free(ctx, type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                         private_destructor);
        }
        free(type->info.bits.bit);
        break;

    case LY_TYPE_DEC64:
        lys_restr_free(ctx, type->info.dec64.range, private_destructor);
        free(type->info.dec64.range);
        break;

    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            lydict_remove(ctx, type->info.enums.enm[i].name);
            lydict_remove(ctx, type->info.enums.enm[i].dsc);
            lydict_remove(ctx, type->info.enums.enm[i].ref);
            lys_iffeature_free(ctx, type->info.enums.enm[i].iffeature, type->info.enums.enm[i].iffeature_size, 0,
                               private_destructor);
            lys_extension_instances_free(ctx, type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                         private_destructor);
        }
        free(type->info.enums.enm);
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        lys_restr_free(ctx, type->info.num.range, private_destructor);
        free(type->info.num.range);
        break;

    case LY_TYPE_LEAFREF:
        lydict_remove(ctx, type->info.lref.path);
        break;

    case LY_TYPE_STRING:
        lys_restr_free(ctx, type->info.str.length, private_destructor);
        free(type->info.str.length);
        for (i = 0; i < type->info.str.pat_count; i++) {
            lys_restr_free(ctx, &type->info.str.patterns[i], private_destructor);
#ifdef LY_ENABLED_CACHE
            if (type->info.str.patterns_pcre) {
                pcre_free((pcre*)type->info.str.patterns_pcre[2 * i]);
                pcre_free_study((pcre_extra*)type->info.str.patterns_pcre[2 * i + 1]);
            }
#endif
        }
        free(type->info.str.patterns);
#ifdef LY_ENABLED_CACHE
        free(type->info.str.patterns_pcre);
#endif
        break;

    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; i++) {
            lys_type_free(ctx, &type->info.uni.types[i], private_destructor);
        }
        free(type->info.uni.types);
        break;

    case LY_TYPE_IDENT:
        free(type->info.ident.ref);
        break;

    default:
        /* nothing to do for LY_TYPE_INST, LY_TYPE_BOOL, LY_TYPE_EMPTY */
        break;
    }
}